

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O1

bool LookupOne(CDBWrapper *db,CBlockIndex *block_index,DBVal *result)

{
  uint256 *puVar1;
  bool bVar2;
  long lVar3;
  undefined4 *puVar4;
  long in_FS_OFFSET;
  byte bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  pair<uint256,_(anonymous_namespace)::DBVal> read_out;
  DBHashKey local_c8 [2];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  FlatFilePos local_28;
  long local_20;
  
  bVar5 = 0;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = (undefined1  [16])0x0;
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_28.nFile = -1;
  local_28.nPos = 0;
  local_c8[0].hash.super_base_blob<256U>.m_data._M_elems._0_4_ = block_index->nHeight;
  bVar2 = CDBWrapper::
          Read<(anonymous_namespace)::DBHeightKey,std::pair<uint256,(anonymous_namespace)::DBVal>>
                    (db,(DBHeightKey *)local_c8,
                     (pair<uint256,_(anonymous_namespace)::DBVal> *)local_88);
  if (bVar2) {
    puVar1 = block_index->phashBlock;
    if (puVar1 == (uint256 *)0x0) {
      __assert_fail("phashBlock != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                    ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
    }
    auVar7[0] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x10] == local_78[0]);
    auVar7[1] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x11] == local_78[1]);
    auVar7[2] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x12] == local_78[2]);
    auVar7[3] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x13] == local_78[3]);
    auVar7[4] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x14] == local_78[4]);
    auVar7[5] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x15] == local_78[5]);
    auVar7[6] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x16] == local_78[6]);
    auVar7[7] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x17] == local_78[7]);
    auVar7[8] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x18] == local_78[8]);
    auVar7[9] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x19] == local_78[9]);
    auVar7[10] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1a] == local_78[10]);
    auVar7[0xb] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1b] == local_78[0xb]);
    auVar7[0xc] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1c] == local_78[0xc]);
    auVar7[0xd] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1d] == local_78[0xd]);
    auVar7[0xe] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1e] == local_78[0xe]);
    auVar7[0xf] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1f] == local_78[0xf]);
    auVar6[0] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0] == local_88[0]);
    auVar6[1] = -((puVar1->super_base_blob<256U>).m_data._M_elems[1] == local_88[1]);
    auVar6[2] = -((puVar1->super_base_blob<256U>).m_data._M_elems[2] == local_88[2]);
    auVar6[3] = -((puVar1->super_base_blob<256U>).m_data._M_elems[3] == local_88[3]);
    auVar6[4] = -((puVar1->super_base_blob<256U>).m_data._M_elems[4] == local_88[4]);
    auVar6[5] = -((puVar1->super_base_blob<256U>).m_data._M_elems[5] == local_88[5]);
    auVar6[6] = -((puVar1->super_base_blob<256U>).m_data._M_elems[6] == local_88[6]);
    auVar6[7] = -((puVar1->super_base_blob<256U>).m_data._M_elems[7] == local_88[7]);
    auVar6[8] = -((puVar1->super_base_blob<256U>).m_data._M_elems[8] == local_88[8]);
    auVar6[9] = -((puVar1->super_base_blob<256U>).m_data._M_elems[9] == local_88[9]);
    auVar6[10] = -((puVar1->super_base_blob<256U>).m_data._M_elems[10] == local_88[10]);
    auVar6[0xb] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xb] == local_88[0xb]);
    auVar6[0xc] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xc] == local_88[0xc]);
    auVar6[0xd] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xd] == local_88[0xd]);
    auVar6[0xe] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xe] == local_88[0xe]);
    auVar6[0xf] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xf] == local_88[0xf]);
    auVar6 = auVar6 & auVar7;
    if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff) {
      puVar4 = (undefined4 *)local_68;
      for (lVar3 = 0x12; lVar3 != 0; lVar3 = lVar3 + -1) {
        *(undefined4 *)(result->hash).super_base_blob<256U>.m_data._M_elems = *puVar4;
        puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
        result = (DBVal *)((long)result + (ulong)bVar5 * -8 + 4);
      }
      bVar2 = true;
    }
    else {
      local_c8[0].hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
      local_c8[0].hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
      local_c8[0].hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
      local_c8[0].hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
      bVar2 = CDBWrapper::Read<(anonymous_namespace)::DBHashKey,(anonymous_namespace)::DBVal>
                        (db,local_c8,result);
    }
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool LookupOne(const CDBWrapper& db, const CBlockIndex* block_index, DBVal& result)
{
    // First check if the result is stored under the height index and the value there matches the
    // block hash. This should be the case if the block is on the active chain.
    std::pair<uint256, DBVal> read_out;
    if (!db.Read(DBHeightKey(block_index->nHeight), read_out)) {
        return false;
    }
    if (read_out.first == block_index->GetBlockHash()) {
        result = std::move(read_out.second);
        return true;
    }

    // If value at the height index corresponds to an different block, the result will be stored in
    // the hash index.
    return db.Read(DBHashKey(block_index->GetBlockHash()), result);
}